

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

void tinyformat::
     format<std::__cxx11::string,int,std::__cxx11::string,std::__cxx11::string,unsigned_int,unsigned_int,unsigned_int,unsigned_long>
               (ostream *out,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,int *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
               uint *args_4,uint *args_5,uint *args_6,unsigned_long *args_7)

{
  long in_FS_OFFSET;
  FormatArg local_e0;
  int *local_c8;
  code *local_c0;
  code *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  code *local_a8;
  code *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  code *local_90;
  code *local_88;
  uint *local_80;
  code *local_78;
  code *local_70;
  uint *local_68;
  code *local_60;
  code *local_58;
  uint *local_50;
  code *local_48;
  code *local_40;
  unsigned_long *local_38;
  code *local_30;
  code *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_e0.m_formatImpl = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_e0.m_toIntImpl = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_c0 = detail::FormatArg::formatImpl<int>;
  local_b8 = detail::FormatArg::toIntImpl<int>;
  local_a8 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_a0 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_90 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_88 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_80 = args_4;
  local_78 = detail::FormatArg::formatImpl<unsigned_int>;
  local_70 = detail::FormatArg::toIntImpl<unsigned_int>;
  local_68 = args_5;
  local_60 = detail::FormatArg::formatImpl<unsigned_int>;
  local_58 = detail::FormatArg::toIntImpl<unsigned_int>;
  local_50 = args_6;
  local_48 = detail::FormatArg::formatImpl<unsigned_int>;
  local_40 = detail::FormatArg::toIntImpl<unsigned_int>;
  local_38 = args_7;
  local_30 = detail::FormatArg::formatImpl<unsigned_long>;
  local_28 = detail::FormatArg::toIntImpl<unsigned_long>;
  local_e0.m_value = args;
  local_c8 = args_1;
  local_b0 = args_2;
  local_98 = args_3;
  detail::formatImpl(out,fmt,&local_e0,8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}